

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

void __thiscall ON_wString::SetAt(ON_wString *this,int i,char c)

{
  ON_wStringHeader *pOVar1;
  char c_local;
  int i_local;
  ON_wString *this_local;
  
  if (-1 < i) {
    pOVar1 = Header(this);
    if (i < pOVar1->string_length) {
      CopyArray(this);
      if ((c < '\0') || ('\x7f' < c)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
                   ,0xa2a,"","c is not a valid single byte utf-8 value.");
      }
      this->m_s[i] = (int)c;
    }
  }
  return;
}

Assistant:

void ON_wString::SetAt( int i, char c )
{
  if ( i >= 0 && i < Header()->string_length ) {
	  CopyArray();
    if (c < 0 || c > 127)
    {
      ON_ERROR("c is not a valid single byte utf-8 value.");
    }
	  m_s[i] = (wchar_t)c;
  }
}